

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O1

void __thiscall
SparseArray_Equal2_Test<unsigned_long>::TestBody(SparseArray_Equal2_Test<unsigned_long> *this)

{
  long lVar1;
  int iVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  unique_ptr<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
  arr2;
  unique_ptr<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
  arr1;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  undefined8 local_38;
  undefined4 local_30;
  
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length._0_4_ = 0;
  local_58.field_2._M_allocated_capacity = 2;
  local_58.field_2._8_4_ = 2;
  local_38 = 4;
  local_30 = 5;
  pstore::sparse_array<int,unsigned_long>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_70,(pair<unsigned_long,_int> *)&local_58);
  local_58._M_dataplus._M_p = (char *)0x0;
  local_58._M_string_length._0_4_ = 0;
  local_58.field_2._M_allocated_capacity = 2;
  local_58.field_2._8_4_ = 2;
  local_38 = 4;
  local_30 = 4;
  pstore::sparse_array<int,unsigned_long>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_80,(pair<unsigned_long,_int> *)&local_58);
  lVar1 = *(long *)local_70;
  local_68[0] = (internal)0x1;
  if (lVar1 == *(long *)local_80._0_8_) {
    if (lVar1 == 0) {
      local_68[0] = (internal)0x0;
    }
    else {
      iVar2 = bcmp((long *)((long)local_70 + 8),(long *)(local_80._0_8_ + 8),
                   (ulong)(uint)((int)POPCOUNT(lVar1) << 2));
      local_68[0] = (internal)(iVar2 != 0);
    }
  }
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)"*arr1 == *arr2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_80 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xfd,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_80 + 8),(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if ((long *)local_80._0_8_ != (long *)0x0) {
    operator_delete((void *)local_80._0_8_);
  }
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

TYPED_TEST (SparseArray, Equal2) {
    auto arr1 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 5}});
    auto arr2 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 4}});
    EXPECT_FALSE (*arr1 == *arr2);
}